

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeMemoryFill
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Name *mem)

{
  _Copy_ctor_base<false,_wasm::Name,_wasm::Err> *p_Var1;
  Name mem_00;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_c0;
  undefined1 local_98 [8];
  Result<wasm::Name> m;
  undefined1 local_50 [8];
  Result<wasm::Name> _val;
  
  getMemory((Result<wasm::Name> *)local_98,this,pos,mem);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_50,
             (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_98);
  if (_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),(string *)local_50);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_50);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_50);
    p_Var1 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)0x0;
    if (m.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
      p_Var1 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_98;
    }
    mem_00.super_IString.str._M_str =
         (p_Var1->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u._M_first._M_storage.
         super_IString.str._M_str;
    mem_00.super_IString.str._M_len = (size_t)local_98;
    IRBuilder::makeMemoryFill((Result<wasm::Ok> *)&local_c0,&this->irBuilder,mem_00);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_c0);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              (&local_c0);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_98);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeMemoryFill(Index pos,
                          const std::vector<Annotation>& annotations,
                          Name* mem) {
    auto m = getMemory(pos, mem);
    CHECK_ERR(m);
    return withLoc(pos, irBuilder.makeMemoryFill(*m));
  }